

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void vkt::memory::anon_unknown_0::createPipelineWithResources
               (DeviceInterface *vkd,VkDevice device,VkRenderPass renderPass,deUint32 subpass,
               VkShaderModule *vertexShaderModule,VkShaderModule *fragmentShaderModule,
               deUint32 viewPortWidth,deUint32 viewPortHeight,
               vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
               *vertexBindingDescriptions,
               vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
               *vertexAttributeDescriptions,
               vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
               *bindings,VkPrimitiveTopology topology,deUint32 pushConstantRangeCount,
               VkPushConstantRange *pushConstantRanges,PipelineResources *resources)

{
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)16>_> data_00;
  RefData<vk::Handle<(vk::HandleType)18>_> data_01;
  bool bVar1;
  size_type sVar2;
  Handle<(vk::HandleType)19> *pHVar3;
  Handle<(vk::HandleType)16> *pHVar4;
  const_reference local_4a8;
  const_reference local_498;
  VkPushConstantRange **local_480;
  const_reference local_468;
  VkPipelineCache local_458;
  Move<vk::Handle<(vk::HandleType)18>_> local_450;
  RefData<vk::Handle<(vk::HandleType)18>_> local_430;
  undefined1 local_410 [8];
  VkGraphicsPipelineCreateInfo createInfo_2;
  VkPipelineColorBlendStateCreateInfo colorBlendState;
  VkPipelineColorBlendAttachmentState attachments [1];
  undefined1 local_320 [8];
  VkPipelineMultisampleStateCreateInfo multisampleState;
  undefined1 auStack_2e8 [4];
  VkSampleMask sampleMask;
  VkPipelineRasterizationStateCreateInfo rasterState;
  VkPipelineViewportStateCreateInfo viewportState;
  VkRect2D scissors [1];
  VkViewport viewports [1];
  undefined1 auStack_248 [8];
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyState;
  undefined1 local_220 [8];
  VkPipelineVertexInputStateCreateInfo vertexInputState;
  VkPipelineDepthStencilStateCreateInfo depthStencilState;
  VkPipelineShaderStageCreateInfo shaderStages [2];
  Move<vk::Handle<(vk::HandleType)16>_> local_120;
  RefData<vk::Handle<(vk::HandleType)16>_> local_100;
  undefined1 local_e0 [8];
  VkPipelineLayoutCreateInfo createInfo_1;
  VkDescriptorSetLayout descriptorSetLayout_;
  Move<vk::Handle<(vk::HandleType)19>_> local_98;
  RefData<vk::Handle<(vk::HandleType)19>_> local_78;
  undefined1 local_58 [8];
  VkDescriptorSetLayoutCreateInfo createInfo;
  VkShaderModule *fragmentShaderModule_local;
  VkShaderModule *vertexShaderModule_local;
  deUint32 subpass_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  VkRenderPass renderPass_local;
  
  createInfo.pBindings = (VkDescriptorSetLayoutBinding *)fragmentShaderModule;
  bVar1 = std::
          vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          ::empty(bindings);
  if (!bVar1) {
    local_58._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
    createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    createInfo._4_4_ = 0;
    createInfo.pNext._0_4_ = 0;
    sVar2 = std::
            vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ::size(bindings);
    createInfo.pNext._4_4_ = (undefined4)sVar2;
    bVar1 = std::
            vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
            ::empty(bindings);
    if (bVar1) {
      local_468 = (const_reference)0x0;
    }
    else {
      local_468 = std::
                  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                  ::operator[](bindings,0);
    }
    createInfo._16_8_ = local_468;
    ::vk::createDescriptorSetLayout
              (&local_98,vkd,device,(VkDescriptorSetLayoutCreateInfo *)local_58,
               (VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)&local_98);
    data.deleter.m_deviceIface = local_78.deleter.m_deviceIface;
    data.object.m_internal = local_78.object.m_internal;
    data.deleter.m_device = local_78.deleter.m_device;
    data.deleter.m_allocator = local_78.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
              (&resources->descriptorSetLayout,data);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_98);
  }
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     (&(resources->descriptorSetLayout).
                       super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  createInfo_1.pPushConstantRanges = (VkPushConstantRange *)pHVar3->m_internal;
  local_e0._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  createInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo_1._4_4_ = 0;
  createInfo_1.pNext._0_4_ = 0;
  bVar1 = ::vk::refdetails::RefBase::operator_cast_to_bool
                    ((RefBase *)&resources->descriptorSetLayout);
  createInfo_1.pNext._4_4_ = (uint)bVar1;
  bVar1 = ::vk::refdetails::RefBase::operator_cast_to_bool
                    ((RefBase *)&resources->descriptorSetLayout);
  if (bVar1) {
    local_480 = &createInfo_1.pPushConstantRanges;
  }
  else {
    local_480 = (VkPushConstantRange **)0x0;
  }
  createInfo_1._16_8_ = local_480;
  createInfo_1.pSetLayouts._0_4_ = pushConstantRangeCount;
  createInfo_1._32_8_ = pushConstantRanges;
  ::vk::createPipelineLayout
            (&local_120,vkd,device,(VkPipelineLayoutCreateInfo *)local_e0,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_100,(Move *)&local_120);
  data_00.deleter.m_deviceIface = local_100.deleter.m_deviceIface;
  data_00.object.m_internal = local_100.object.m_internal;
  data_00.deleter.m_device = local_100.deleter.m_device;
  data_00.deleter.m_allocator = local_100.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::operator=
            (&resources->pipelineLayout,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_120);
  depthStencilState.minDepthBounds = 2.52234e-44;
  memset(&vertexInputState.pVertexAttributeDescriptions,0,0x68);
  vertexInputState.pVertexAttributeDescriptions._0_4_ = 0x19;
  depthStencilState.depthTestEnable = 7;
  depthStencilState.front.passOp = VK_STENCIL_OP_DECREMENT_AND_WRAP;
  depthStencilState.back.passOp = VK_STENCIL_OP_DECREMENT_AND_WRAP;
  depthStencilState.back.writeMask = 0xbf800000;
  depthStencilState.back.reference = 0x3f800000;
  local_220._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexInputState._4_4_ = 0;
  vertexInputState.pNext._0_4_ = 0;
  sVar2 = std::
          vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
          ::size(vertexBindingDescriptions);
  vertexInputState.pNext._4_4_ = (undefined4)sVar2;
  bVar1 = std::
          vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
          ::empty(vertexBindingDescriptions);
  if (bVar1) {
    local_498 = (const_reference)0x0;
  }
  else {
    local_498 = std::
                vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                ::operator[](vertexBindingDescriptions,0);
  }
  vertexInputState._16_8_ = local_498;
  sVar2 = std::
          vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
          ::size(vertexAttributeDescriptions);
  vertexInputState.pVertexBindingDescriptions._0_4_ = (undefined4)sVar2;
  bVar1 = std::
          vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
          ::empty(vertexAttributeDescriptions);
  if (bVar1) {
    local_4a8 = (const_reference)0x0;
  }
  else {
    local_4a8 = std::
                vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                ::operator[](vertexAttributeDescriptions,0);
  }
  vertexInputState._32_8_ = local_4a8;
  inputAssemblyState.flags = 0;
  inputAssemblyState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  inputAssemblyState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  inputAssemblyState._4_4_ = 0;
  auStack_248 = (undefined1  [8])0x14;
  inputAssemblyState.pNext = (void *)((ulong)topology << 0x20);
  scissors[0].extent.width = 0;
  scissors[0].extent.height = 0;
  viewportState.pScissors._0_4_ = 0;
  viewportState.pScissors._4_4_ = 0;
  scissors[0].offset.x = viewPortWidth;
  scissors[0].offset.y = viewPortHeight;
  rasterState.lineWidth = 3.08286e-44;
  viewportState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  viewportState._4_4_ = 0;
  viewportState.pNext._0_4_ = 0;
  viewportState.pNext._4_4_ = 1;
  viewportState._16_8_ = &scissors[0].extent;
  viewportState.pViewports._0_4_ = 1;
  viewportState._32_8_ = &viewportState.pScissors;
  rasterState.depthBiasEnable = 0;
  rasterState.depthBiasConstantFactor = 0.0;
  rasterState.rasterizerDiscardEnable = 0;
  rasterState.polygonMode = VK_POLYGON_MODE_FILL;
  rasterState.cullMode = 0;
  rasterState.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  rasterState.flags = 0;
  rasterState.depthClampEnable = 0;
  rasterState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  rasterState._4_4_ = 0;
  auStack_2e8 = (undefined1  [4])0x17;
  sampleMask = 0;
  rasterState.pNext = (void *)0x100000000;
  rasterState.depthBiasClamp = 1.0;
  rasterState.depthBiasSlopeFactor = 0.0;
  multisampleState.alphaToOneEnable = 0xffffffff;
  local_320._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  multisampleState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  multisampleState._4_4_ = 0;
  multisampleState.pNext._0_4_ = 0;
  multisampleState.pNext._4_4_ = 1;
  multisampleState.flags = 0;
  multisampleState.rasterizationSamples = 0;
  multisampleState._24_8_ = &multisampleState.alphaToOneEnable;
  multisampleState.pSampleMask._0_4_ = 0;
  multisampleState.pSampleMask._4_4_ = 0;
  colorBlendState.blendConstants[2] = 0.0;
  colorBlendState.blendConstants[3] = 1.4013e-45;
  createInfo_2.basePipelineIndex = 0x1a;
  colorBlendState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorBlendState._4_4_ = 0;
  colorBlendState.pNext._0_4_ = 0;
  colorBlendState.pNext._4_4_ = 0;
  colorBlendState.flags = 3;
  colorBlendState.logicOpEnable = 1;
  colorBlendState._24_8_ = colorBlendState.blendConstants + 2;
  colorBlendState.pAttachments._0_4_ = 0;
  colorBlendState.pAttachments._4_4_ = 0;
  colorBlendState.blendConstants[0] = 0.0;
  colorBlendState.blendConstants[1] = 0.0;
  local_410._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  createInfo_2.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo_2._4_4_ = 0;
  createInfo_2.pNext._0_4_ = 0;
  createInfo_2.pNext._4_4_ = 2;
  createInfo_2._16_8_ = &depthStencilState.minDepthBounds;
  createInfo_2.pStages = (VkPipelineShaderStageCreateInfo *)local_220;
  createInfo_2.pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)auStack_248;
  createInfo_2.pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  createInfo_2.pTessellationState = (VkPipelineTessellationStateCreateInfo *)&rasterState.lineWidth;
  createInfo_2.pViewportState = (VkPipelineViewportStateCreateInfo *)auStack_2e8;
  createInfo_2.pRasterizationState = (VkPipelineRasterizationStateCreateInfo *)local_320;
  createInfo_2.pMultisampleState =
       (VkPipelineMultisampleStateCreateInfo *)&vertexInputState.pVertexAttributeDescriptions;
  createInfo_2.pDepthStencilState =
       (VkPipelineDepthStencilStateCreateInfo *)&createInfo_2.basePipelineIndex;
  createInfo_2.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(resources->pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  createInfo_2.pDynamicState = (VkPipelineDynamicStateCreateInfo *)pHVar4->m_internal;
  createInfo_2.layout.m_internal = renderPass.m_internal;
  createInfo_2.renderPass.m_internal._0_4_ = subpass;
  ::vk::Handle<(vk::HandleType)18>::Handle((Handle<(vk::HandleType)18> *)&createInfo_2.subpass,0);
  createInfo_2.basePipelineHandle.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_458,0);
  ::vk::createGraphicsPipeline
            (&local_450,vkd,device,local_458,(VkGraphicsPipelineCreateInfo *)local_410,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_430,(Move *)&local_450);
  data_01.deleter.m_deviceIface = local_430.deleter.m_deviceIface;
  data_01.object.m_internal = local_430.object.m_internal;
  data_01.deleter.m_device = local_430.deleter.m_device;
  data_01.deleter.m_allocator = local_430.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=(&resources->pipeline,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_450);
  return;
}

Assistant:

void createPipelineWithResources (const vk::DeviceInterface&							vkd,
								  const vk::VkDevice									device,
								  const vk::VkRenderPass								renderPass,
								  const deUint32										subpass,
								  const vk::VkShaderModule&								vertexShaderModule,
								  const vk::VkShaderModule&								fragmentShaderModule,
								  const deUint32										viewPortWidth,
								  const deUint32										viewPortHeight,
								  const vector<vk::VkVertexInputBindingDescription>&	vertexBindingDescriptions,
								  const vector<vk::VkVertexInputAttributeDescription>&	vertexAttributeDescriptions,
								  const vector<vk::VkDescriptorSetLayoutBinding>&		bindings,
								  const vk::VkPrimitiveTopology							topology,
								  deUint32												pushConstantRangeCount,
								  const vk::VkPushConstantRange*						pushConstantRanges,
								  PipelineResources&									resources)
{
	if (!bindings.empty())
	{
		const vk::VkDescriptorSetLayoutCreateInfo createInfo =
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
			DE_NULL,

			0u,
			(deUint32)bindings.size(),
			bindings.empty() ? DE_NULL : &bindings[0]
		};

		resources.descriptorSetLayout = vk::createDescriptorSetLayout(vkd, device, &createInfo);
	}

	{
		const vk::VkDescriptorSetLayout			descriptorSetLayout_	= *resources.descriptorSetLayout;
		const vk::VkPipelineLayoutCreateInfo	createInfo				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,
			DE_NULL,
			0,

			resources.descriptorSetLayout ? 1u : 0u,
			resources.descriptorSetLayout ? &descriptorSetLayout_ : DE_NULL,

			pushConstantRangeCount,
			pushConstantRanges
		};

		resources.pipelineLayout = vk::createPipelineLayout(vkd, device, &createInfo);
	}

	{
		const vk::VkPipelineShaderStageCreateInfo			shaderStages[]					=
		{
			{
				vk::VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
				DE_NULL,
				0,
				vk::VK_SHADER_STAGE_VERTEX_BIT,
				vertexShaderModule,
				"main",
				DE_NULL
			},
			{
				vk::VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
				DE_NULL,
				0,
				vk::VK_SHADER_STAGE_FRAGMENT_BIT,
				fragmentShaderModule,
				"main",
				DE_NULL
			}
		};
		const vk::VkPipelineDepthStencilStateCreateInfo		depthStencilState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,
			DE_NULL,
			0u,
			DE_FALSE,
			DE_FALSE,
			vk::VK_COMPARE_OP_ALWAYS,
			DE_FALSE,
			DE_FALSE,
			{
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_COMPARE_OP_ALWAYS,
				0u,
				0u,
				0u,
			},
			{
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_COMPARE_OP_ALWAYS,
				0u,
				0u,
				0u,
			},
			-1.0f,
			+1.0f
		};
		const vk::VkPipelineVertexInputStateCreateInfo		vertexInputState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,
			DE_NULL,
			0u,

			(deUint32)vertexBindingDescriptions.size(),
			vertexBindingDescriptions.empty() ? DE_NULL : &vertexBindingDescriptions[0],

			(deUint32)vertexAttributeDescriptions.size(),
			vertexAttributeDescriptions.empty() ? DE_NULL : &vertexAttributeDescriptions[0]
		};
		const vk::VkPipelineInputAssemblyStateCreateInfo	inputAssemblyState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,
			DE_NULL,
			0,
			topology,
			VK_FALSE
		};
		const vk::VkViewport								viewports[]						=
		{
			{ 0.0f, 0.0f, (float)viewPortWidth, (float)viewPortHeight, 0.0f, 1.0f }
		};
		const vk::VkRect2D									scissors[]						=
		{
			{ { 0, 0 }, { (deUint32)viewPortWidth, (deUint32)viewPortHeight } }
		};
		const vk::VkPipelineViewportStateCreateInfo			viewportState					=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,
			DE_NULL,
			0,
			DE_LENGTH_OF_ARRAY(viewports),
			viewports,
			DE_LENGTH_OF_ARRAY(scissors),
			scissors
		};
		const vk::VkPipelineRasterizationStateCreateInfo	rasterState						=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,
			DE_NULL,
			0,

			VK_TRUE,
			VK_FALSE,
			vk::VK_POLYGON_MODE_FILL,
			vk::VK_CULL_MODE_NONE,
			vk::VK_FRONT_FACE_COUNTER_CLOCKWISE,
			VK_FALSE,
			0.0f,
			0.0f,
			0.0f,
			1.0f
		};
		const vk::VkSampleMask								sampleMask						= ~0u;
		const vk::VkPipelineMultisampleStateCreateInfo		multisampleState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,
			DE_NULL,
			0,

			vk::VK_SAMPLE_COUNT_1_BIT,
			VK_FALSE,
			0.0f,
			&sampleMask,
			VK_FALSE,
			VK_FALSE
		};
		const vk::VkPipelineColorBlendAttachmentState		attachments[]					=
		{
			{
				VK_FALSE,
				vk::VK_BLEND_FACTOR_ONE,
				vk::VK_BLEND_FACTOR_ZERO,
				vk::VK_BLEND_OP_ADD,
				vk::VK_BLEND_FACTOR_ONE,
				vk::VK_BLEND_FACTOR_ZERO,
				vk::VK_BLEND_OP_ADD,
				(vk::VK_COLOR_COMPONENT_R_BIT|
				 vk::VK_COLOR_COMPONENT_G_BIT|
				 vk::VK_COLOR_COMPONENT_B_BIT|
				 vk::VK_COLOR_COMPONENT_A_BIT)
			}
		};
		const vk::VkPipelineColorBlendStateCreateInfo		colorBlendState					=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,
			DE_NULL,
			0,

			VK_FALSE,
			vk::VK_LOGIC_OP_COPY,
			DE_LENGTH_OF_ARRAY(attachments),
			attachments,
			{ 0.0f, 0.0f, 0.0f, 0.0f }
		};
		const vk::VkGraphicsPipelineCreateInfo				createInfo						=
		{
			vk::VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,
			DE_NULL,
			0u,

			DE_LENGTH_OF_ARRAY(shaderStages),
			shaderStages,

			&vertexInputState,
			&inputAssemblyState,
			DE_NULL,
			&viewportState,
			&rasterState,
			&multisampleState,
			&depthStencilState,
			&colorBlendState,
			DE_NULL,
			*resources.pipelineLayout,
			renderPass,
			subpass,
			0,
			0
		};

		resources.pipeline = vk::createGraphicsPipeline(vkd, device, 0, &createInfo);
	}
}